

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::InvalidateFboUnbindBlitCase::render
          (InvalidateFboUnbindBlitCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  int i;
  int iVar3;
  int iVar4;
  int iVar5;
  ChannelOrder CVar6;
  deUint32 program;
  long lVar7;
  Context *pCVar9;
  int width;
  deUint32 depthStencilRbo;
  deUint32 colorRbo;
  deUint32 fbo;
  Vec2 quadNDCRightTopXY;
  undefined1 local_1d8 [8];
  ulong uStack_1d0;
  Vec2 quadNDCSize;
  Vec2 quadNDCLeftBottomXY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  Vec3 local_194;
  FlatColorShader flatShader;
  TextureFormat TVar8;
  
  iVar5 = this->m_numSamples;
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  iVar3 = sglr::ContextWrapper::getWidth(this_00);
  width = 0x80;
  if (iVar3 < 0x80) {
    width = iVar3;
  }
  if (iVar5 == 0) {
    width = iVar3;
  }
  iVar5 = this->m_numSamples;
  iVar4 = sglr::ContextWrapper::getHeight(this_00);
  iVar3 = 0x80;
  if (iVar4 < 0x80) {
    iVar3 = iVar4;
  }
  if (iVar5 == 0) {
    iVar3 = iVar4;
  }
  quadNDCLeftBottomXY.m_data[0] = -1.0;
  quadNDCLeftBottomXY.m_data[1] = -1.0;
  iVar5 = sglr::ContextWrapper::getWidth(this_00);
  iVar4 = sglr::ContextWrapper::getHeight(this_00);
  quadNDCSize.m_data[0] = ((float)width + (float)width) / (float)iVar5;
  quadNDCSize.m_data[1] = ((float)iVar3 + (float)iVar3) / (float)iVar4;
  quadNDCRightTopXY.m_data[0] = 0.0;
  quadNDCRightTopXY.m_data[1] = 0.0;
  lVar7 = 0;
  do {
    quadNDCRightTopXY.m_data[lVar7] = quadNDCLeftBottomXY.m_data[lVar7] + quadNDCSize.m_data[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 == 1);
  if (this->m_depthStencilFmt == 0) {
    CVar6 = CHANNELORDER_LAST;
  }
  else {
    TVar8 = glu::mapGLInternalFormat(this->m_depthStencilFmt);
    CVar6 = TVar8.order;
  }
  fbo = 0;
  colorRbo = 0;
  depthStencilRbo = 0;
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,TYPE_FLOAT_VEC4);
  getFBODiscardAttachments(&attachments,this->m_invalidateBuffers);
  pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar9->_vptr_Context[0x75])(pCVar9,&flatShader);
  sglr::ContextWrapper::glClearColor(this_00,0.0,0.0,0.0,1.0);
  sglr::ContextWrapper::glClear(this_00,0x4500);
  sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&colorRbo);
  sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,colorRbo);
  sglr::ContextWrapper::glRenderbufferStorageMultisample
            (this_00,0x8d41,this->m_numSamples,this->m_colorFmt,width,iVar3);
  if (this->m_depthStencilFmt != 0) {
    sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&depthStencilRbo);
    sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,depthStencilRbo);
    sglr::ContextWrapper::glRenderbufferStorageMultisample
              (this_00,0x8d41,this->m_numSamples,this->m_depthStencilFmt,width,iVar3);
  }
  sglr::ContextWrapper::glGenFramebuffers(this_00,1,&fbo);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,colorRbo);
  if ((CVar6 == DS) || (CVar6 == D)) {
    sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d00,0x8d41,depthStencilRbo);
  }
  if (CVar6 - S < 2) {
    sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d20,0x8d41,depthStencilRbo);
  }
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glClear(this_00,0x4500);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,1,0xff);
  pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1d8._0_4_ = 1.0;
  local_1d8._4_4_ = 0.0;
  uStack_1d0._0_4_ = 0.0;
  uStack_1d0._4_4_ = 1.0;
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar9,program,(Vec4 *)local_1d8);
  pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1d8._0_4_ = -1.0;
  local_1d8._4_4_ = -1.0;
  uStack_1d0 = CONCAT44(uStack_1d0._4_4_,0xbf800000);
  fVar1 = quadNDCRightTopXY.m_data[0];
  fVar2 = quadNDCRightTopXY.m_data[1];
  local_194.m_data[0] = quadNDCRightTopXY.m_data[0];
  local_194.m_data[1] = quadNDCRightTopXY.m_data[1];
  local_194.m_data[2] = 1.0;
  sglr::drawQuad(pCVar9,program,(Vec3 *)local_1d8,&local_194);
  sglr::ContextWrapper::glInvalidateFramebuffer
            (this_00,0x8d40,
             (int)((ulong)((long)attachments.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)attachments.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2),
             attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca9,0);
  sglr::ContextWrapper::glBlitFramebuffer
            (this_00,0,0,width,iVar3,0,0,width,iVar3,~this->m_invalidateBuffers & 0x4500,0x2600);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca8,0);
  if ((this->m_invalidateBuffers & 0x4000) != 0) {
    sglr::ContextWrapper::glDisable(this_00,0xb71);
    sglr::ContextWrapper::glDisable(this_00,0xb90);
    pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_1d8._0_4_ = 0.0;
    local_1d8._4_4_ = 1.0;
    uStack_1d0 = 0x3f80000000000000;
    FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar9,program,(Vec4 *)local_1d8);
    pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_1d8._0_4_ = -1.0;
    local_1d8._4_4_ = -1.0;
    uStack_1d0 = uStack_1d0 & 0xffffffff00000000;
    local_194.m_data[0] = fVar1;
    local_194.m_data[1] = fVar2;
    local_194.m_data[2] = 0.0;
    sglr::drawQuad(pCVar9,program,(Vec3 *)local_1d8,&local_194);
    sglr::ContextWrapper::glEnable(this_00,0xb71);
    sglr::ContextWrapper::glEnable(this_00,0xb90);
  }
  if ((this->m_invalidateBuffers & 0x100) != 0) {
    sglr::ContextWrapper::glDepthFunc(this_00,0x207);
  }
  if ((this->m_invalidateBuffers & 0x400) == 0) {
    sglr::ContextWrapper::glStencilFunc(this_00,0x202,1,0xff);
  }
  sglr::ContextWrapper::glEnable(this_00,0xbe2);
  sglr::ContextWrapper::glBlendFunc(this_00,1,1);
  sglr::ContextWrapper::glBlendEquation(this_00,0x8006);
  pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1d8._0_4_ = 0.0;
  local_1d8._4_4_ = 0.0;
  uStack_1d0 = (ulong)&DAT_3f8000003f800000;
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar9,program,(Vec4 *)local_1d8);
  pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1d8._0_4_ = quadNDCLeftBottomXY.m_data[0];
  local_1d8._4_4_ = quadNDCLeftBottomXY.m_data[1];
  uStack_1d0 = uStack_1d0 & 0xffffffff00000000;
  local_194.m_data[0] = fVar1;
  local_194.m_data[1] = fVar2;
  local_194.m_data[2] = 0.0;
  sglr::drawQuad(pCVar9,program,(Vec3 *)local_1d8,&local_194);
  FboTestCase::readPixels(&this->super_FboTestCase,dst,0,0,width,iVar3);
  if (attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)attachments.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)attachments.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		// \note When using fullscreen viewport (when m_numSamples > 0), still only use a 128x128 pixel quad at most.
		IVec2					quadSizePixels			(m_numSamples == 0 ? getWidth() : de::min(128, getWidth()),
														 m_numSamples == 0 ? getHeight() : de::min(128, getHeight()));
		Vec2					quadNDCLeftBottomXY		(-1.0f, -1.0f);
		Vec2					quadNDCSize				(2.0f*(float)quadSizePixels.x()/(float)getWidth(), 2.0f*(float)quadSizePixels.y()/(float)getHeight());
		Vec2					quadNDCRightTopXY		= quadNDCLeftBottomXY + quadNDCSize;
		tcu::TextureFormat		depthStencilFmt			= m_depthStencilFmt != GL_NONE ? glu::mapGLInternalFormat(m_depthStencilFmt) : tcu::TextureFormat();
		bool					depth					= depthStencilFmt.order == tcu::TextureFormat::D || depthStencilFmt.order == tcu::TextureFormat::DS;
		bool					stencil					= depthStencilFmt.order == tcu::TextureFormat::S || depthStencilFmt.order == tcu::TextureFormat::DS;
		deUint32				fbo						= 0;
		deUint32				colorRbo				= 0;
		deUint32				depthStencilRbo			= 0;
		FlatColorShader			flatShader				(glu::TYPE_FLOAT_VEC4);
		vector<deUint32>		attachments				= getFBODiscardAttachments(m_invalidateBuffers);
		deUint32				flatShaderID			= getCurrentContext()->createProgram(&flatShader);

		glClearColor	(0.0f, 0.0f, 0.0f, 1.0f);
		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		// Create fbo.
		glGenRenderbuffers					(1, &colorRbo);
		glBindRenderbuffer					(GL_RENDERBUFFER, colorRbo);
		glRenderbufferStorageMultisample	(GL_RENDERBUFFER, m_numSamples, m_colorFmt, quadSizePixels.x(), quadSizePixels.y());

		if (m_depthStencilFmt != GL_NONE)
		{
			glGenRenderbuffers					(1, &depthStencilRbo);
			glBindRenderbuffer					(GL_RENDERBUFFER, depthStencilRbo);
			glRenderbufferStorageMultisample	(GL_RENDERBUFFER, m_numSamples, m_depthStencilFmt, quadSizePixels.x(), quadSizePixels.y());
		}

		glGenFramebuffers			(1, &fbo);
		glBindFramebuffer			(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);

		if (depth)
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

		if (stencil)
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

		checkFramebufferStatus		(GL_FRAMEBUFFER);

		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(quadNDCLeftBottomXY.x(), quadNDCLeftBottomXY.y(), -1.0f), Vec3(quadNDCRightTopXY.x(), quadNDCRightTopXY.y(), 1.0f));

		glInvalidateFramebuffer(GL_FRAMEBUFFER, (int)attachments.size(), &attachments[0]);

		// Set default framebuffer as draw framebuffer and blit preserved buffers.
		glBindFramebuffer	(GL_DRAW_FRAMEBUFFER, 0);
		glBlitFramebuffer	(0, 0, quadSizePixels.x(), quadSizePixels.y(),
							 0, 0, quadSizePixels.x(), quadSizePixels.y(),
							 (GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT) & ~m_invalidateBuffers, GL_NEAREST);
		glBindFramebuffer	(GL_READ_FRAMEBUFFER, 0);

		if ((m_invalidateBuffers & GL_COLOR_BUFFER_BIT) != 0)
		{
			// Color was not preserved - fill with green.
			glDisable(GL_DEPTH_TEST);
			glDisable(GL_STENCIL_TEST);

			flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));
			sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(quadNDCLeftBottomXY.x(), quadNDCLeftBottomXY.y(), 0.0f), Vec3(quadNDCRightTopXY.x(), quadNDCRightTopXY.y(), 0.0f));

			glEnable(GL_DEPTH_TEST);
			glEnable(GL_STENCIL_TEST);
		}

		if ((m_invalidateBuffers & GL_DEPTH_BUFFER_BIT) != 0)
		{
			// Depth was not preserved.
			glDepthFunc(GL_ALWAYS);
		}

		if ((m_invalidateBuffers & GL_STENCIL_BUFFER_BIT) == 0)
		{
			// Stencil was preserved.
			glStencilFunc(GL_EQUAL, 1, 0xff);
		}

		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(quadNDCLeftBottomXY.x(), quadNDCLeftBottomXY.y(), 0.0f), Vec3(quadNDCRightTopXY.x(), quadNDCRightTopXY.y(), 0.0f));

		readPixels(dst, 0, 0, quadSizePixels.x(), quadSizePixels.y());
	}